

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_attribute __thiscall
pugi::xml_node::insert_copy_before(xml_node *this,xml_attribute *proto,xml_attribute *attr)

{
  char_t *pcVar1;
  char *source;
  xml_attribute local_20;
  
  if (proto->_attr == (xml_attribute_struct *)0x0) {
    xml_attribute::xml_attribute(&local_20);
  }
  else {
    pcVar1 = proto->_attr->name;
    if (pcVar1 == (char_t *)0x0) {
      pcVar1 = "";
    }
    local_20 = insert_attribute_before(this,pcVar1,attr);
    source = "";
    if (proto->_attr != (xml_attribute_struct *)0x0) {
      pcVar1 = proto->_attr->value;
      source = "";
      if (pcVar1 != (char_t *)0x0) {
        source = pcVar1;
      }
    }
    if (local_20._attr == (xml_attribute_struct *)0x0) {
      local_20._attr = (xml_attribute_struct *)0x0;
    }
    else {
      impl::anon_unknown_0::strcpy_insitu
                (&(local_20._attr)->value,&(local_20._attr)->header,8,source);
    }
  }
  return (xml_attribute)local_20._attr;
}

Assistant:

PUGI__FN bool xml_attribute::operator!() const
	{
		return !_attr;
	}